

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O2

pfdistances * prepare_pfdistances(player *p,loc start,_Bool only_known,_Bool forbid_traps)

{
  int iVar1;
  chunk_conflict2 *pcVar2;
  loc_conflict grid1;
  player *ppVar3;
  _Bool _Var4;
  wchar_t wVar5;
  pfdistances *ppVar6;
  int *piVar7;
  int **ppiVar8;
  ulong uVar9;
  queue *q;
  uintptr_t uVar10;
  size_t sVar11;
  loc lVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  wchar_t wVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  loc_conflict local_60;
  queue *local_58;
  wchar_t local_4c;
  wchar_t local_48;
  wchar_t local_44;
  wchar_t local_40;
  wchar_t local_3c;
  player *local_38;
  
  if (p->cave != (chunk_conflict2 *)0x0) {
    _Var4 = square_in_bounds_fully((chunk_conflict *)p->cave,start);
    uVar17 = 0;
    if (_Var4) {
      ppVar6 = (pfdistances *)mem_alloc(0x20);
      piVar7 = (int *)mem_alloc((long)p->cave->width * (long)p->cave->height * 4);
      ppVar6->buffer = piVar7;
      ppiVar8 = (int **)mem_alloc((long)p->cave->height << 3);
      ppVar6->rows = ppiVar8;
      ppVar6->start = start;
      pcVar2 = p->cave;
      wVar5 = pcVar2->height;
      ppVar6->height = wVar5;
      wVar16 = pcVar2->width;
      uVar9 = (ulong)wVar16;
      uVar14 = (ulong)(uint)wVar5;
      if (wVar5 < L'\x01') {
        uVar14 = uVar17;
      }
      ppVar6->width = wVar16;
      for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
        ppVar6->rows[uVar18] = (int *)((long)ppVar6->buffer + uVar17);
        uVar17 = uVar17 + uVar9 * 4;
      }
      for (lVar15 = 0; (int)lVar15 < (int)uVar9; lVar15 = lVar15 + 1) {
        (*ppVar6->rows)[lVar15] = -1;
        uVar9 = (ulong)(uint)ppVar6->width;
      }
      local_60.y = L'\x01';
      while (local_60.y < ppVar6->height + L'\xffffffff') {
        piVar7 = ppVar6->rows[local_60.y];
        *piVar7 = -1;
        wVar5 = local_60.y;
        for (wVar16 = L'\x01'; iVar1 = local_60.y, wVar16 < ppVar6->width + L'\xffffffff';
            wVar16 = wVar16 + L'\x01') {
          lVar12.y = local_60.y;
          lVar12.x = wVar16;
          local_60.x = wVar16;
          _Var4 = is_valid_pf(p,lVar12,only_known,forbid_traps);
          piVar7 = ppVar6->rows[iVar1];
          piVar7[wVar16] = _Var4 - 1 | 0x7fffffff;
          wVar5 = iVar1;
        }
        piVar7[(long)ppVar6->width + -1] = -1;
        local_60.y = wVar5 + L'\x01';
      }
      ppiVar8 = ppVar6->rows;
      for (lVar15 = 0; local_60.x = (int)lVar15, local_60.x < ppVar6->width; lVar15 = lVar15 + 1) {
        ppiVar8[(long)ppVar6->height + -1][lVar15] = -1;
      }
      ppiVar8[(ppVar6->start).y][(ppVar6->start).x] = 0;
      local_3c = compute_unlocked_penalty(p);
      local_40 = compute_locked_penalty(p);
      local_44 = compute_rubble_penalty(p);
      local_48 = compute_passable_rubble_penalty(p);
      local_38 = p;
      local_4c = compute_tree_penalty(p);
      q = q_new((long)((ppVar6->height + ppVar6->width) * 2 + -4));
      wVar5 = grid_to_i((loc_conflict)ppVar6->start,ppVar6->width);
      q_push(q,(long)wVar5);
      local_58 = q;
      do {
        uVar10 = q_pop(q);
        i_to_grid((wchar_t)uVar10,ppVar6->width,&local_60);
        if (ppVar6->rows[local_60.y][local_60.x] < 0x7fffffef) {
          iVar1 = ppVar6->rows[local_60.y][local_60.x] + 0x10;
          for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
            grid1.y = local_60.y;
            grid1.x = local_60.x;
            lVar12 = (loc)loc_sum(grid1,(loc_conflict)ddgrid_ddd[lVar15]);
            ppVar3 = local_38;
            lVar19 = (long)lVar12 >> 0x20;
            wVar5 = lVar12.x;
            if (iVar1 < ppVar6->rows[lVar19][wVar5]) {
              _Var4 = square_isknown((chunk_conflict *)local_38->cave,lVar12);
              if ((!_Var4) ||
                 (_Var4 = square_ispassable((chunk_conflict *)ppVar3->cave,lVar12), _Var4)) {
                ppVar6->rows[lVar19][wVar5] = iVar1;
LAB_001adf55:
                q = local_58;
                sVar11 = q_len(local_58);
                sVar13 = q_size(q);
                if ((sVar13 < sVar11) || (sVar11 = q_size(q), sVar11 == 0)) {
                  __assert_fail("q_len(pending) <= q_size(pending) && q_size(pending) > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                                ,0x1e9,
                                "struct pfdistances *prepare_pfdistances(struct player *, struct loc, _Bool, _Bool)"
                               );
                }
                sVar11 = q_len(q);
                sVar13 = q_size(q);
                if (sVar11 == sVar13) {
                  sVar11 = q_size(q);
                  if (-1 < (long)sVar11) {
                    sVar11 = q_size(q);
                    _Var4 = q_resize(q,sVar11 * 2);
                    if (!_Var4) goto LAB_001adfbf;
                  }
                }
                else {
LAB_001adfbf:
                  wVar5 = grid_to_i((loc_conflict)lVar12,ppVar6->width);
                  q_push(q,(long)wVar5);
                }
              }
              else {
                _Var4 = square_iscloseddoor((chunk_conflict *)ppVar3->cave,lVar12);
                if (_Var4) {
                  _Var4 = square_islockeddoor((chunk_conflict *)ppVar3->cave,lVar12);
                  wVar16 = local_3c;
                  if (_Var4) {
                    wVar16 = local_40;
                  }
                }
                else {
                  _Var4 = square_isrubble((chunk_conflict *)ppVar3->cave,lVar12);
                  if (_Var4) {
                    _Var4 = square_ispassable((chunk_conflict *)ppVar3->cave,lVar12);
                    wVar16 = local_44;
                    if (_Var4) {
                      wVar16 = local_48;
                    }
                  }
                  else {
                    _Var4 = square_istree((chunk_conflict *)ppVar3->cave,lVar12);
                    q = local_58;
                    wVar16 = local_4c;
                    if (!_Var4) goto LAB_001adfd6;
                  }
                }
                q = local_58;
                if (iVar1 < (wVar16 ^ 0x7fffffffU)) {
                  if (wVar16 + iVar1 < ppVar6->rows[lVar19][wVar5]) {
                    ppVar6->rows[lVar19][wVar5] = wVar16 + iVar1;
                    goto LAB_001adf55;
                  }
                }
              }
            }
LAB_001adfd6:
          }
        }
        sVar11 = q_len(q);
        if (sVar11 == 0) {
          q_free(q);
          return ppVar6;
        }
      } while( true );
    }
  }
  return (pfdistances *)0x0;
}

Assistant:

struct pfdistances *prepare_pfdistances(struct player *p, struct loc start,
		bool only_known, bool forbid_traps)
{
	struct pfdistances *result;
	struct loc grid;
	struct queue *pending;
	int unlocked_penalty, locked_penalty, rubble_penalty, prubble_penalty,
		tree_penalty;

	if (!p->cave || !square_in_bounds_fully(p->cave, start)) {
		return NULL;
	}

	result = mem_alloc(sizeof(*result));
	result->buffer = mem_alloc(p->cave->height * p->cave->width
		* sizeof(*result->buffer));
	result->rows = mem_alloc(p->cave->height * sizeof(*result->rows));
	result->start = start;
	result->height = p->cave->height;
	result->width = p->cave->width;

	/* Set up the row pointers. */
	for (grid.y = 0; grid.y < result->height; ++grid.y) {
		result->rows[grid.y] = result->buffer + grid.y * result->width;
	}

	/*
	 * Mark the outer edge as unreachable (negative distance).  Keeps
	 * things in bounds without extra checks later.  Inner grids may
	 * be unreachable; otherwise they start with the assumption of
	 * the maximum possible distance.
	 */
	grid.y = 0;
	for (grid.x = 0; grid.x < result->width; ++grid.x) {
		result->rows[0][grid.x] = -1;
	}
	for (grid.y = 1; grid.y < result->height - 1; ++grid.y) {
		result->rows[grid.y][0] = -1;
		for (grid.x = 1; grid.x < result->width - 1; ++grid.x) {
			result->rows[grid.y][grid.x] = (is_valid_pf(p, grid,
				only_known, forbid_traps)) ?  INT_MAX : -1;
		}
		result->rows[grid.y][result->width - 1] = -1;
	}
	for (grid.x = 0; grid.x < result->width; ++grid.x) {
		result->rows[result->height - 1][grid.x] = -1;
	}

	/* The distance to the starting point is zero. */
	result->rows[result->start.y][result->start.x] = 0;

	/* Precompute quantities to penalize traversing some terrain;
	 * we ignore slowing in water and speedups in trees for now. */
	unlocked_penalty = compute_unlocked_penalty(p);
	locked_penalty = compute_locked_penalty(p);
	rubble_penalty = compute_rubble_penalty(p);
	prubble_penalty = compute_passable_rubble_penalty(p);
	tree_penalty = compute_tree_penalty(p);

	/*
	 * Set up a queue with the feasible points that remain to be
	 * considered.  The length of the perimeter of the cave is a guess
	 * at how many feasible points may be present at once.  Will try to
	 * resize if that turns out to be inadequate.
	 */
	pending = q_new(2 * (result->width + result->height - 2));
	/* The starting point is the point to consider. */
	q_push_int(pending, grid_to_i(result->start, result->width));

	/*
	 * For a feasible point, check the eight neighors to see if they
	 * are feasible.
	 */
	do {
		int cur_distance, i;

		i_to_grid(q_pop_int(pending), result->width, &grid);
		cur_distance = result->rows[grid.y][grid.x];
		/*
		 * Move one grid, i.e. PF_SCL, to get to the next grid.  If
		 * that exceeds the maximum distance possible, have no
		 * feasible points from the one under consideration.
		 */
		if (cur_distance >= INT_MAX - PF_SCL) {
			continue;
		}
		cur_distance += PF_SCL;

		/* Try the neighbors. */
		for (i = 0; i < 8; ++i) {
			struct loc next = loc_sum(grid, ddgrid_ddd[i]);

			/*
			 * Skip points that are unreachable or which have
			 * already been reached by a path which is at least
			 * as short as the path under consideration.
			 */
			if (result->rows[next.y][next.x] <= cur_distance) {
				continue;
			}
			/*
			 * Add next as a feasible point; penalize some terrain
			 * if it is known and hard to traverse.
			 */
			if (!square_isknown(p->cave, next)
					|| square_ispassable(p->cave, next)) {
				result->rows[next.y][next.x] = cur_distance;
			} else {
				int penalty, penalized_distance;

				if (square_iscloseddoor(p->cave, next)) {
					penalty = (square_islockeddoor(p->cave,
						next)) ? locked_penalty :
						unlocked_penalty;
				} else if (square_isrubble(p->cave, next)) {
					if (square_ispassable(p->cave, next)) {
						penalty = prubble_penalty;
					} else {
						penalty = rubble_penalty;
					}
				} else if (square_istree(p->cave, next)) {
					penalty = tree_penalty;
				} else {
					/*
					 * Should not happen, treat it as
					 * completely impassable.
					 */
					continue;
				}

				if (cur_distance >= INT_MAX - penalty) {
					/*
					 * Will exceed the maximum allowed
					 * distance so next is not feasible.
					 */
					continue;
				}
				penalized_distance = cur_distance + penalty;
				if (result->rows[next.y][next.x]
						<= penalized_distance) {
					/*
					 * Already have a path there that is
					 * shorter or the same length.  Do not
					 * need to consider this one.
					 */
					continue;
				}
				result->rows[next.y][next.x] =
					penalized_distance;
			}

			assert(q_len(pending) <= q_size(pending)
				&& q_size(pending) > 0);
			if (q_len(pending) == q_size(pending)) {
				if (q_size(pending) > SIZE_MAX / 2
						|| q_resize(pending,
						2 * q_size(pending))) {
					/*
					 * Can not hold the new pending
					 * feasible grid so skip it.
					 */
					continue;
				}
			}
			q_push_int(pending, grid_to_i(next, result->width));
		}
	} while (q_len(pending) > 0);

	q_free(pending);

	return result;
}